

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

bool __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
::
try_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,int>
          (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
           *this,progress_guarantee i_progress_guarantee,int *i_construction_params)

{
  bool bVar1;
  reentrant_put_transaction<Func> local_68;
  undefined1 local_48 [8];
  reentrant_put_transaction<Func> tranasction;
  int *i_construction_params_local;
  progress_guarantee i_progress_guarantee_local;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  
  tranasction.m_queue =
       (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
        *)i_construction_params;
  try_start_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,int>
            (&local_68,this,i_progress_guarantee,i_construction_params);
  reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
  ::
  reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,void>
            ((reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
              *)local_48,&local_68);
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_68);
  bVar1 = density::lf_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)local_48);
  if (bVar1) {
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)local_48);
  }
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)local_48);
  return bVar1;
}

Assistant:

bool
          try_reentrant_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(
              std::declval<lf_heter_queue>().template try_start_reentrant_emplace<ELEMENT_TYPE>(
                i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)))
        {
            auto tranasction = try_start_reentrant_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }